

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::relaxedMaddF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  anon_unknown_0::
  ternary<2,_&wasm::Literal::getLanesF64x2,_&wasm::Literal::madd,_&wasm::passThrough>
            (__return_storage_ptr__,this,left,right);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedMaddF64x2(const Literal& left,
                                  const Literal& right) const {
  return ternary<2, &Literal::getLanesF64x2, &Literal::madd>(
    *this, left, right);
}